

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-active.c
# Opt level: O1

int run_test_active(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  uv_timer_t timer;
  uv_timer_t local_a0;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&local_a0);
  if (iVar1 == 0) {
    iVar1 = uv_is_active((uv_handle_t *)&local_a0);
    if (iVar1 != 0) goto LAB_0014986d;
    iVar1 = uv_is_closing((uv_handle_t *)&local_a0);
    if (iVar1 != 0) goto LAB_00149872;
    iVar1 = uv_timer_start(&local_a0,timer_cb,1000,0);
    if (iVar1 != 0) goto LAB_00149877;
    iVar1 = uv_is_active((uv_handle_t *)&local_a0);
    if (iVar1 != 1) goto LAB_0014987c;
    iVar1 = uv_is_closing((uv_handle_t *)&local_a0);
    if (iVar1 != 0) goto LAB_00149881;
    iVar1 = uv_timer_stop(&local_a0);
    if (iVar1 != 0) goto LAB_00149886;
    iVar1 = uv_is_active((uv_handle_t *)&local_a0);
    if (iVar1 != 0) goto LAB_0014988b;
    iVar1 = uv_is_closing((uv_handle_t *)&local_a0);
    if (iVar1 != 0) goto LAB_00149890;
    iVar1 = uv_timer_start(&local_a0,timer_cb,1000,0);
    if (iVar1 != 0) goto LAB_00149895;
    iVar1 = uv_is_active((uv_handle_t *)&local_a0);
    if (iVar1 != 1) goto LAB_0014989a;
    iVar1 = uv_is_closing((uv_handle_t *)&local_a0);
    if (iVar1 != 0) goto LAB_0014989f;
    uv_close((uv_handle_t *)&local_a0,close_cb);
    iVar1 = uv_is_active((uv_handle_t *)&local_a0);
    if (iVar1 != 0) goto LAB_001498a4;
    iVar1 = uv_is_closing((uv_handle_t *)&local_a0);
    if (iVar1 != 1) goto LAB_001498a9;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001498ae;
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001498b8;
    }
  }
  else {
    run_test_active_cold_1();
LAB_0014986d:
    run_test_active_cold_2();
LAB_00149872:
    run_test_active_cold_3();
LAB_00149877:
    run_test_active_cold_4();
LAB_0014987c:
    run_test_active_cold_5();
LAB_00149881:
    run_test_active_cold_6();
LAB_00149886:
    run_test_active_cold_7();
LAB_0014988b:
    run_test_active_cold_8();
LAB_00149890:
    run_test_active_cold_9();
LAB_00149895:
    run_test_active_cold_10();
LAB_0014989a:
    run_test_active_cold_11();
LAB_0014989f:
    run_test_active_cold_12();
LAB_001498a4:
    run_test_active_cold_13();
LAB_001498a9:
    run_test_active_cold_14();
LAB_001498ae:
    run_test_active_cold_15();
  }
  run_test_active_cold_16();
LAB_001498b8:
  run_test_active_cold_17();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
          ,0x27,"0 && \"timer_cb should not have been called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(active) {
  int r;
  uv_timer_t timer;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  /* uv_is_active() and uv_is_closing() should always return either 0 or 1. */
  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT(r == 0);

  ASSERT(1 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_stop(&timer);
  ASSERT(r == 0);

  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT(r == 0);

  ASSERT(1 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  uv_close((uv_handle_t*) &timer, close_cb);

  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(1 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}